

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

int verify_cert(ptls_verify_certificate_t *_self,ptls_t *tls,char *server_name,
               _func_int_void_ptr_uint16_t_ptls_iovec_t_ptls_iovec_t **verifier,void **verify_data,
               ptls_iovec_t *certs,size_t num_certs)

{
  X509_STORE *store;
  uint16_t *puVar1;
  char *__s;
  int iVar2;
  int iVar3;
  stack_st_X509 *chain;
  X509 *x509;
  X509 *pXVar4;
  X509_STORE_CTX *ctx;
  X509_VERIFY_PARAM *param;
  size_t sVar5;
  EVP_PKEY *pEVar6;
  long lVar7;
  size_t *psVar8;
  uint8_t *p;
  uint8_t *local_48;
  char *local_40;
  void **local_38;
  
  local_38 = verify_data;
  chain = (stack_st_X509 *)OPENSSL_sk_new_null();
  if (num_certs == 0) {
    iVar3 = 0x74;
    iVar2 = 0;
    x509 = (X509 *)0x0;
  }
  else {
    local_48 = certs->base;
    local_40 = server_name;
    x509 = d2i_X509((X509 **)0x0,&local_48,certs->len);
    iVar3 = 0x2a;
    if (x509 == (X509 *)0x0) {
      x509 = (X509 *)0x0;
      goto LAB_00122a99;
    }
    if (num_certs != 1) {
      lVar7 = num_certs - 1;
      psVar8 = &certs[1].len;
      do {
        local_48 = ((ptls_iovec_t *)(psVar8 + -1))->base;
        pXVar4 = d2i_X509((X509 **)0x0,&local_48,*psVar8);
        if (pXVar4 == (X509 *)0x0) goto LAB_00122a99;
        OPENSSL_sk_push(chain,pXVar4);
        psVar8 = psVar8 + 2;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
    }
    store = (X509_STORE *)_self[1].cb;
    iVar2 = ptls_is_server(tls);
    ctx = X509_STORE_CTX_new();
    if (ctx == (X509_STORE_CTX *)0x0) {
      iVar3 = 0x201;
      iVar2 = 0;
      goto LAB_00122a3d;
    }
    iVar3 = X509_STORE_CTX_init(ctx,store,x509,chain);
    if (iVar3 == 1) {
      param = X509_STORE_CTX_get0_param(ctx);
      X509_VERIFY_PARAM_set_purpose(param,(iVar2 == 0) + 1);
      X509_VERIFY_PARAM_set_depth(param,0x62);
      __s = local_40;
      if (local_40 != (char *)0x0 && iVar2 == 0) {
        iVar2 = ptls_server_name_is_ipaddr(local_40);
        if (iVar2 == 0) {
          sVar5 = strlen(__s);
          X509_VERIFY_PARAM_set1_host(param,__s,sVar5);
          X509_VERIFY_PARAM_set_hostflags(param,4);
        }
        else {
          X509_VERIFY_PARAM_set1_ip_asc(param,__s);
        }
      }
      iVar2 = X509_verify_cert(ctx);
      if (iVar2 == 1) {
        iVar2 = 0;
        iVar3 = 0;
      }
      else {
        iVar2 = X509_STORE_CTX_get_error(ctx);
        if (iVar2 < 0x11) {
          if (1 < iVar2 - 9U) {
            if (iVar2 == 2) goto switchD_001229ea_caseD_14;
            goto switchD_001229ea_caseD_12;
          }
          iVar3 = 0x2d;
        }
        else {
          switch(iVar2) {
          case 0x11:
            iVar3 = 0x201;
            break;
          case 0x12:
          case 0x13:
          case 0x15:
          case 0x16:
          case 0x18:
          case 0x19:
          case 0x1a:
switchD_001229ea_caseD_12:
            iVar3 = 0x2e;
            break;
          case 0x14:
          case 0x1b:
          case 0x1c:
switchD_001229ea_caseD_14:
            iVar3 = 0x30;
            break;
          case 0x17:
            iVar3 = 0x2c;
            break;
          default:
            if ((iVar2 != 0x3e) && (iVar2 != 0x4f)) goto switchD_001229ea_caseD_12;
            iVar3 = 0x2a;
          }
        }
      }
    }
    else {
      iVar3 = 0x203;
      iVar2 = 0;
    }
    X509_STORE_CTX_free(ctx);
  }
LAB_00122a3d:
  puVar1 = _self[1].algos;
  if (puVar1 != (uint16_t *)0x0) {
    iVar3 = (**(code **)puVar1)(puVar1,tls,iVar3,iVar2,x509,chain);
  }
  if ((num_certs != 0) && (iVar3 == 0)) {
    pEVar6 = X509_get_pubkey(x509);
    *local_38 = pEVar6;
    if (pEVar6 == (EVP_PKEY *)0x0) {
      iVar3 = 0x2a;
    }
    else {
      *verifier = verify_sign;
      iVar3 = 0;
    }
  }
LAB_00122a99:
  if (chain != (stack_st_X509 *)0x0) {
    OPENSSL_sk_pop_free(chain,X509_free);
  }
  if (x509 != (X509 *)0x0) {
    X509_free(x509);
  }
  return iVar3;
}

Assistant:

static int verify_cert(ptls_verify_certificate_t *_self, ptls_t *tls, const char *server_name,
                       int (**verifier)(void *, uint16_t, ptls_iovec_t, ptls_iovec_t), void **verify_data, ptls_iovec_t *certs,
                       size_t num_certs)
{
    ptls_openssl_verify_certificate_t *self = (ptls_openssl_verify_certificate_t *)_self;
    X509 *cert = NULL;
    STACK_OF(X509) *chain = sk_X509_new_null();
    size_t i;
    int ossl_x509_err, ret;

    /* If any certs are given, convert them to OpenSSL representation, then verify the cert chain. If no certs are given, just give
     * the override_callback to see if we want to stay fail open. */
    if (num_certs != 0) {
        if ((cert = to_x509(certs[0])) == NULL) {
            ret = PTLS_ALERT_BAD_CERTIFICATE;
            goto Exit;
        }
        for (i = 1; i != num_certs; ++i) {
            X509 *interm = to_x509(certs[i]);
            if (interm == NULL) {
                ret = PTLS_ALERT_BAD_CERTIFICATE;
                goto Exit;
            }
            sk_X509_push(chain, interm);
        }
        ret = verify_cert_chain(self->cert_store, cert, chain, ptls_is_server(tls), server_name, &ossl_x509_err);
    } else {
        ret = PTLS_ALERT_CERTIFICATE_REQUIRED;
        ossl_x509_err = 0;
    }

    /* When override callback is available, let it override the error. */
    if (self->override_callback != NULL)
        ret = self->override_callback->cb(self->override_callback, tls, ret, ossl_x509_err, cert, chain);

    if (ret != 0 || num_certs == 0)
        goto Exit;

    /* extract public key for verifying the TLS handshake signature */
    if ((*verify_data = X509_get_pubkey(cert)) == NULL) {
        ret = PTLS_ALERT_BAD_CERTIFICATE;
        goto Exit;
    }
    *verifier = verify_sign;

Exit:
    if (chain != NULL)
        sk_X509_pop_free(chain, X509_free);
    if (cert != NULL)
        X509_free(cert);
    return ret;
}